

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.hpp
# Opt level: O2

void mxx::env::set_exception_on_error(void)

{
  MPI_Errhandler errhandler;
  undefined8 local_10;
  
  MPI_Comm_create_errhandler(my_mpi_errorhandler,&local_10);
  MPI_Comm_set_errhandler(&ompi_mpi_comm_world,local_10);
  return;
}

Assistant:

static void set_exception_on_error() {
        // set custom error handler (for debugging with working stack-trace on gdb)
        MPI_Errhandler errhandler;
#if MPI_VERSION >= 2
        MPI_Comm_create_errhandler(&my_mpi_errorhandler, &errhandler);
        MPI_Comm_set_errhandler(MPI_COMM_WORLD, errhandler);
#else
        MPI_Errhandler_create(&my_mpi_errorhandler, &errhandler);
        MPI_Errhandler_set(MPI_COMM_WORLD, errhandler);
#endif
    }